

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O2

void uavs3d_ipred_ang_y_32_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  pel *ppVar3;
  undefined1 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 uStack_119;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 auStack_108 [31];
  
  uVar17 = (long)height / 2 & 0xffffffff;
  iVar8 = (int)((long)height / 2);
  iVar22 = iVar8 + width + -1;
  iVar9 = height;
  if (iVar22 < height) {
    iVar9 = iVar22;
  }
  uVar18 = (long)(iVar8 + width + 0x3e) & 0xfffffffffffffff0;
  pauVar20 = (undefined1 (*) [16])(src + -0x11);
  auVar24._8_2_ = 2;
  auVar24._0_8_ = 0x2000200020002;
  auVar24._10_2_ = 2;
  auVar24._12_2_ = 2;
  auVar24._14_2_ = 2;
  auVar24._16_2_ = 2;
  auVar24._18_2_ = 2;
  auVar24._20_2_ = 2;
  auVar24._22_2_ = 2;
  auVar24._24_2_ = 2;
  auVar24._26_2_ = 2;
  auVar24._28_2_ = 2;
  auVar24._30_2_ = 2;
  for (lVar19 = 0; lVar19 < iVar9 + -4; lVar19 = lVar19 + 8) {
    auVar26 = vpmovzxbw_avx2(*(undefined1 (*) [16])(pauVar20[-1] + 0xe));
    auVar6 = vpmovzxbw_avx2(*(undefined1 (*) [16])(pauVar20[-1] + 0xf));
    auVar7 = vpmovzxbw_avx2(*pauVar20);
    auVar26 = vpaddw_avx2(auVar26,auVar7);
    auVar6 = vpaddw_avx2(auVar6,auVar6);
    auVar26 = vpaddw_avx2(auVar26,auVar6);
    auVar26 = vpaddw_avx2(auVar26,auVar24);
    auVar26 = vpsrlw_avx2(auVar26,2);
    auVar23 = vpackuswb_avx(auVar26._0_16_,auVar26._16_16_);
    auVar25 = vpshufb_avx(auVar23,ZEXT816(0x1030507090b0d0f));
    auVar23 = vpshufb_avx(auVar23,ZEXT816(0x20406080a0c0e));
    *(long *)((long)&uStack_118 + lVar19) = auVar25._0_8_;
    *(long *)((long)&uStack_118 + lVar19 + uVar18) = auVar23._0_8_;
    pauVar20 = pauVar20 + -1;
  }
  if ((int)lVar19 < iVar9) {
    auVar23 = vpunpckhbw_avx(*(undefined1 (*) [16])(pauVar20[-1] + 0xe),(undefined1  [16])0x0);
    auVar25 = vpunpckhbw_avx(*(undefined1 (*) [16])(pauVar20[-1] + 0xf),(undefined1  [16])0x0);
    auVar5 = vpunpckhbw_avx(*pauVar20,(undefined1  [16])0x0);
    auVar23 = vpaddw_avx(auVar5,auVar23);
    auVar25 = vpaddw_avx(auVar25,auVar25);
    auVar23 = vpaddw_avx(auVar23,auVar25);
    auVar25._8_2_ = 2;
    auVar25._0_8_ = 0x2000200020002;
    auVar25._10_2_ = 2;
    auVar25._12_2_ = 2;
    auVar25._14_2_ = 2;
    auVar23 = vpaddw_avx(auVar23,auVar25);
    auVar23 = vpsrlw_avx(auVar23,2);
    auVar23 = vpackuswb_avx(auVar23,auVar23);
    auVar25 = vpshufb_avx(auVar23,_DAT_0017a160);
    auVar23 = vpshufb_avx(auVar23,_DAT_0017a170);
    *(int *)((long)&uStack_118 + lVar19) = auVar23._0_4_;
    *(int *)((long)&uStack_118 + lVar19 + uVar18) = auVar25._0_4_;
  }
  if (height < iVar22) {
    uVar4 = (&uStack_119)[(long)iVar9 + uVar18];
    for (lVar19 = (long)height; lVar19 < iVar22; lVar19 = lVar19 + 1) {
      *(undefined1 *)((long)&uStack_118 + lVar19) = uVar4;
      *(undefined1 *)((long)&uStack_118 + lVar19 + 1) = uVar4;
      *(undefined1 *)((long)&uStack_118 + lVar19 + 2) = uVar4;
      *(undefined1 *)((long)&uStack_118 + lVar19 + 3) = uVar4;
      *(undefined1 *)((long)&uStack_118 + lVar19 + 4) = uVar4;
      *(undefined1 *)((long)&uStack_118 + lVar19 + 5) = uVar4;
      *(undefined1 *)((long)&uStack_118 + lVar19 + 6) = uVar4;
      *(undefined1 *)((long)&uStack_118 + lVar19 + 7) = uVar4;
      *(undefined1 *)((long)&uStack_110 + lVar19) = uVar4;
      *(undefined1 *)((long)&uStack_110 + lVar19 + 1) = uVar4;
      *(undefined1 *)((long)&uStack_110 + lVar19 + 2) = uVar4;
      *(undefined1 *)((long)&uStack_110 + lVar19 + 3) = uVar4;
      *(undefined1 *)((long)&uStack_110 + lVar19 + 4) = uVar4;
      *(undefined1 *)((long)&uStack_110 + lVar19 + 5) = uVar4;
      *(undefined1 *)((long)&uStack_110 + lVar19 + 6) = uVar4;
      *(undefined1 *)((long)&uStack_110 + lVar19 + 7) = uVar4;
      puVar1 = (undefined1 *)((long)&uStack_118 + lVar19 + uVar18);
      *puVar1 = uVar4;
      puVar1[1] = uVar4;
      puVar1[2] = uVar4;
      puVar1[3] = uVar4;
      puVar1[4] = uVar4;
      puVar1[5] = uVar4;
      puVar1[6] = uVar4;
      puVar1[7] = uVar4;
      puVar1[8] = uVar4;
      puVar1[9] = uVar4;
      puVar1[10] = uVar4;
      puVar1[0xb] = uVar4;
      puVar1[0xc] = uVar4;
      puVar1[0xd] = uVar4;
      puVar1[0xe] = uVar4;
      puVar1[0xf] = uVar4;
    }
  }
  iVar9 = i_dst * 2;
  if (width == 4) {
    uVar21 = 0;
    if (iVar8 < 1) {
      uVar17 = 0;
    }
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      *(undefined4 *)dst = *(undefined4 *)((long)&uStack_118 + uVar21);
      *(undefined4 *)(dst + i_dst) = *(undefined4 *)((long)&uStack_118 + uVar21 + uVar18);
      dst = dst + iVar9;
    }
  }
  else if (width == 8) {
    uVar21 = 0;
    if (iVar8 < 1) {
      uVar17 = 0;
    }
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      *(undefined8 *)dst = *(undefined8 *)((long)&uStack_118 + uVar21);
      *(undefined8 *)(dst + i_dst) = *(undefined8 *)((long)&uStack_118 + uVar21 + uVar18);
      dst = dst + iVar9;
    }
  }
  else if (width == 0x10) {
    uVar21 = 0;
    if (iVar8 < 1) {
      uVar17 = 0;
    }
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      uVar10 = *(undefined8 *)((long)&uStack_110 + uVar21);
      *(undefined8 *)dst = *(undefined8 *)((long)&uStack_118 + uVar21);
      *(undefined8 *)(dst + 8) = uVar10;
      puVar2 = (undefined8 *)((long)&uStack_118 + uVar21 + uVar18);
      uVar10 = puVar2[1];
      *(undefined8 *)(dst + i_dst) = *puVar2;
      *(undefined8 *)(dst + i_dst + 8) = uVar10;
      dst = dst + iVar9;
    }
  }
  else if (width == 0x20) {
    uVar21 = 0;
    if (iVar8 < 1) {
      uVar17 = 0;
    }
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      uVar10 = *(undefined8 *)((long)&uStack_110 + uVar21);
      uVar11 = *(undefined8 *)((long)auStack_108 + uVar21);
      uVar12 = *(undefined8 *)((long)auStack_108 + uVar21 + 8);
      *(undefined8 *)dst = *(undefined8 *)((long)&uStack_118 + uVar21);
      *(undefined8 *)(dst + 8) = uVar10;
      *(undefined8 *)(dst + 0x10) = uVar11;
      *(undefined8 *)(dst + 0x18) = uVar12;
      puVar2 = (undefined8 *)((long)&uStack_118 + uVar21 + uVar18);
      uVar10 = puVar2[1];
      uVar11 = puVar2[2];
      uVar12 = puVar2[3];
      ppVar3 = dst + i_dst;
      *(undefined8 *)ppVar3 = *puVar2;
      *(undefined8 *)(ppVar3 + 8) = uVar10;
      *(undefined8 *)(ppVar3 + 0x10) = uVar11;
      *(undefined8 *)(ppVar3 + 0x18) = uVar12;
      dst = dst + iVar9;
    }
  }
  else if (width == 0x40) {
    uVar21 = 0;
    if (iVar8 < 1) {
      uVar17 = 0;
    }
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      uVar10 = *(undefined8 *)((long)&uStack_118 + uVar21);
      uVar11 = *(undefined8 *)((long)&uStack_110 + uVar21);
      uVar12 = *(undefined8 *)((long)auStack_108 + uVar21);
      uVar13 = *(undefined8 *)((long)auStack_108 + uVar21 + 8);
      uVar14 = *(undefined8 *)((long)auStack_108 + uVar21 + 0x18);
      uVar15 = *(undefined8 *)((long)auStack_108 + uVar21 + 0x20);
      uVar16 = *(undefined8 *)((long)auStack_108 + uVar21 + 0x28);
      *(undefined8 *)(dst + 0x20) = *(undefined8 *)((long)auStack_108 + uVar21 + 0x10);
      *(undefined8 *)(dst + 0x28) = uVar14;
      *(undefined8 *)(dst + 0x30) = uVar15;
      *(undefined8 *)(dst + 0x38) = uVar16;
      *(undefined8 *)dst = uVar10;
      *(undefined8 *)(dst + 8) = uVar11;
      *(undefined8 *)(dst + 0x10) = uVar12;
      *(undefined8 *)(dst + 0x18) = uVar13;
      puVar2 = (undefined8 *)((long)&uStack_118 + uVar21 + uVar18);
      uVar10 = *puVar2;
      uVar11 = puVar2[1];
      uVar12 = puVar2[2];
      uVar13 = puVar2[3];
      puVar2 = (undefined8 *)((long)auStack_108 + uVar21 + uVar18 + 0x10);
      uVar14 = puVar2[1];
      uVar15 = puVar2[2];
      uVar16 = puVar2[3];
      ppVar3 = dst + (long)i_dst + 0x20;
      *(undefined8 *)ppVar3 = *puVar2;
      *(undefined8 *)(ppVar3 + 8) = uVar14;
      *(undefined8 *)(ppVar3 + 0x10) = uVar15;
      *(undefined8 *)(ppVar3 + 0x18) = uVar16;
      ppVar3 = dst + i_dst;
      *(undefined8 *)ppVar3 = uVar10;
      *(undefined8 *)(ppVar3 + 8) = uVar11;
      *(undefined8 *)(ppVar3 + 0x10) = uVar12;
      *(undefined8 *)(ppVar3 + 0x18) = uVar13;
      dst = dst + iVar9;
    }
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_y_32_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    ALIGNED_16(pel first_line[2 * (64 + 64)]);
    int line_size = height / 2 + width - 1;
    int real_size = COM_MIN(line_size, height);
    int i;
    __m128i pad_val;
    int aligned_line_size = ((line_size + 63) >> 4) << 4;
    pel *pfirst[2];
    __m256i coeff2 = _mm256_set1_epi16(2);
    __m256i zero = _mm256_setzero_si256();
    __m128i shuffle1 = _mm_setr_epi8(15, 13, 11, 9, 7, 5, 3, 1, 14, 12, 10, 8, 6, 4, 2, 0);
    __m128i shuffle2 = _mm_setr_epi8(14, 12, 10, 8, 6, 4, 2, 0, 15, 13, 11, 9, 7, 5, 3, 1);
    int i_dst2 = i_dst * 2;

    pfirst[0] = first_line;
    pfirst[1] = first_line + aligned_line_size;

    src -= 18;

    for (i = 0; i < real_size - 4; i += 8, src -= 16) {
        __m256i p0, p1;
        __m256i S0 = _mm256_set_epi64x(0, *(s64 *)(src + 7), 0, *(s64 *)(src - 1));
        __m256i S1 = _mm256_set_epi64x(0, *(s64 *)(src + 8), 0, *(s64 *)(src));
        __m256i S2 = _mm256_set_epi64x(0, *(s64 *)(src + 9), 0, *(s64 *)(src + 1));

        __m256i L0 = _mm256_unpacklo_epi8(S0, zero);
        __m256i L1 = _mm256_unpacklo_epi8(S1, zero);
        __m256i L2 = _mm256_unpacklo_epi8(S2, zero);
        __m128i m0, d0, d1;

        p0 = _mm256_add_epi16(L0, L1);
        p1 = _mm256_add_epi16(L1, L2);
        p0 = _mm256_add_epi16(p0, coeff2);
        p0 = _mm256_add_epi16(p0, p1);
        p0 = _mm256_srli_epi16(p0, 2);

        m0 = _mm_packus_epi16(_mm256_castsi256_si128(p0), _mm256_extracti128_si256(p0, 1));
        d0 = _mm_shuffle_epi8(m0, shuffle1);
        d1 = _mm_shuffle_epi8(m0, shuffle2);
        _mm_storel_epi64((__m128i *)&pfirst[0][i], d0);
        _mm_storel_epi64((__m128i *)&pfirst[1][i], d1);
    }

    if (i < real_size) {
        __m128i coeff2 = _mm_set1_epi16(2);
        __m128i zero = _mm_setzero_si128();
        __m128i p10, p11;
        __m128i S2 = _mm_loadu_si128((__m128i *)(src + 1));
        __m128i S0 = _mm_loadu_si128((__m128i *)(src - 1));
        __m128i S1 = _mm_loadu_si128((__m128i *)(src));

        __m128i H0 = _mm_unpackhi_epi8(S0, zero);
        __m128i H1 = _mm_unpackhi_epi8(S1, zero);
        __m128i H2 = _mm_unpackhi_epi8(S2, zero);

        p10 = _mm_add_epi16(H0, H1);
        p11 = _mm_add_epi16(H1, H2);
        p10 = _mm_add_epi16(p10, coeff2);
        p10 = _mm_add_epi16(p10, p11);
        p10 = _mm_srli_epi16(p10, 2);

        p11 = _mm_packus_epi16(p10, p10);
        p10 = _mm_shuffle_epi8(p11, shuffle2);
        p11 = _mm_shuffle_epi8(p11, shuffle1);
        ((int *)&pfirst[0][i])[0] = _mm_cvtsi128_si32(p11);
        ((int *)&pfirst[1][i])[0] = _mm_cvtsi128_si32(p10);
    }

    // padding
    if (real_size < line_size) {
        pad_val = _mm_set1_epi8((char)pfirst[1][real_size - 1]);
        for (i = real_size; i < line_size; i++) {
            _mm_storeu_si128((__m128i *)&pfirst[0][i], pad_val);
            _mm_storeu_si128((__m128i *)&pfirst[1][i], pad_val);
        }
    }

    height /= 2;

#define COPY_Y32(w) { \
    for (i = 0; i < height; i++) { \
        memcpy(dst, pfirst[0] + i, w * sizeof(pel)); \
        memcpy(dst + i_dst, pfirst[1] + i, w * sizeof(pel)); \
        dst += i_dst2;\
    } \
}
    switch (width) {
    case 4:
        COPY_Y32(4)
            break;
    case 8:
        COPY_Y32(8)
            break;
    case 16:
        COPY_Y32(16)
            break;
    case 32:
        COPY_Y32(32)
            break;
    case 64:
        COPY_Y32(64)
            break;
    }
}